

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O0

void deqp::gles2::Functional::deleteTex2DAttachedToBoundFboTest(TestContext *testCtx,Context *ctx)

{
  uint local_1c;
  Context *pCStack_18;
  deUint32 tex2D;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  pCStack_18 = ctx;
  ctx_local = (Context *)testCtx;
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  local_1c = 1;
  (*pCStack_18->_vptr_Context[6])(pCStack_18,0xde1,1);
  (*pCStack_18->_vptr_Context[0x1e])(pCStack_18,0x8d40,0x8ce0,0xde1,(ulong)local_1c,0);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8ce0,0x8cd0,0x1702);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8ce0,0x8cd1,local_1c);
  (*pCStack_18->_vptr_Context[8])(pCStack_18,1,&local_1c);
  checkFboAttachmentParam((TestContext *)ctx_local,pCStack_18,0x8ce0,0x8cd0,0);
  return;
}

Assistant:

static void deleteTex2DAttachedToBoundFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	deUint32 tex2D = 1;
	ctx.bindTexture(GL_TEXTURE_2D, tex2D);
	ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, 0);

	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_TEXTURE);
	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, tex2D);

	ctx.deleteTextures(1, &tex2D);

	checkFboAttachmentParam(testCtx, ctx, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_NONE);
}